

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,UnderwaterAcousticEmitterBeam *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Underwater Acoustic Emitter Beam:");
  poVar1 = std::operator<<(poVar1,"\n\tBeam Data Length:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8BeamDataLength);
  poVar1 = std::operator<<(poVar1,"\n\tBeam ID Number:\t\t          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8BeamIDNumber);
  UnderwaterAcousticFundamentalParameterData::GetAsString_abi_cxx11_(&local_1c0,&this->m_UAFPD);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString UnderwaterAcousticEmitterBeam::GetAsString() const
{
    KStringStream ss;

    ss << "Underwater Acoustic Emitter Beam:"
       << "\n\tBeam Data Length:              " << ( KUINT16 )m_ui8BeamDataLength
       << "\n\tBeam ID Number:		          " << ( KUINT16 )m_ui8BeamIDNumber
       << m_UAFPD.GetAsString();

    return ss.str();
}